

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O3

CF2_F16Dot16 cf2_hintmap_map(CF2_HintMap hintmap,CF2_F16Dot16 csCoord)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  CF2_F16Dot16 *pCVar6;
  
  if ((hintmap->count == 0) || (hintmap->hinted == '\0')) {
    lVar5 = (long)csCoord * (long)hintmap->scale;
    return (CF2_F16Dot16)((ulong)((lVar5 >> 0x3f) + lVar5 + 0x8000) >> 0x10);
  }
  uVar2 = hintmap->lastIndex;
  uVar1 = hintmap->count - 1;
  if (uVar1 < uVar2) {
    uVar1 = uVar2;
  }
  uVar4 = (ulong)uVar1;
  lVar5 = 0;
  pCVar6 = &hintmap->edge[(ulong)uVar2 + 1].csCoord;
  do {
    if (uVar2 - uVar4 == lVar5) goto LAB_00210e75;
    lVar5 = lVar5 + -1;
    iVar3 = *pCVar6;
    pCVar6 = pCVar6 + 8;
  } while (iVar3 <= csCoord);
  uVar4 = (ulong)(~(uint)lVar5 + uVar2);
LAB_00210e75:
  uVar2 = (uint)uVar4;
  do {
    if (uVar2 == 0) {
      hintmap->lastIndex = 0;
      iVar3 = hintmap->edge[0].csCoord;
      if (csCoord < iVar3) {
        lVar5 = (long)(csCoord - iVar3) * (long)hintmap->scale;
        iVar3 = (int)((ulong)(lVar5 + (lVar5 >> 0x3f) + 0x8000) >> 0x10) + hintmap->edge[0].dsCoord;
      }
      else {
        uVar4 = 0;
LAB_00210ee5:
        lVar5 = (long)(csCoord - hintmap->edge[uVar4].csCoord) * (long)hintmap->edge[uVar4].scale;
        iVar3 = (int)((ulong)((lVar5 >> 0x3f) + lVar5 + 0x8000) >> 0x10) +
                hintmap->edge[uVar4].dsCoord;
      }
      return iVar3;
    }
    if (hintmap->edge[uVar4].csCoord <= csCoord) {
      hintmap->lastIndex = (FT_UFast)uVar4;
      goto LAB_00210ee5;
    }
    uVar2 = (FT_UFast)uVar4 - 1;
    uVar4 = (ulong)uVar2;
  } while( true );
}

Assistant:

static CF2_Fixed
  cf2_hintmap_map( CF2_HintMap  hintmap,
                   CF2_Fixed    csCoord )
  {
    if ( hintmap->count == 0 || ! hintmap->hinted )
    {
      /* there are no hints; use uniform scale and zero offset */
      return FT_MulFix( csCoord, hintmap->scale );
    }
    else
    {
      /* start linear search from last hit */
      CF2_UInt  i = hintmap->lastIndex;


      FT_ASSERT( hintmap->lastIndex < CF2_MAX_HINT_EDGES );

      /* search up */
      while ( i < hintmap->count - 1                  &&
              csCoord >= hintmap->edge[i + 1].csCoord )
        i += 1;

      /* search down */
      while ( i > 0 && csCoord < hintmap->edge[i].csCoord )
        i -= 1;

      hintmap->lastIndex = i;

      if ( i == 0 && csCoord < hintmap->edge[0].csCoord )
      {
        /* special case for points below first edge: use uniform scale */
        return ADD_INT32( FT_MulFix( SUB_INT32( csCoord,
                                                hintmap->edge[0].csCoord ),
                                     hintmap->scale ),
                          hintmap->edge[0].dsCoord );
      }
      else
      {
        /*
         * Note: entries with duplicate csCoord are allowed.
         * Use edge[i], the highest entry where csCoord >= entry[i].csCoord
         */
        return ADD_INT32( FT_MulFix( SUB_INT32( csCoord,
                                                hintmap->edge[i].csCoord ),
                                     hintmap->edge[i].scale ),
                          hintmap->edge[i].dsCoord );
      }
    }
  }